

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaParser.cpp
# Opt level: O2

void __thiscall
ParsedAACTrackData::ParsedAACTrackData(ParsedAACTrackData *this,uint8_t *buff,int size)

{
  (this->super_ParsedTrackPrivData)._vptr_ParsedTrackPrivData =
       (_func_int **)&PTR__ParsedTrackPrivData_0024afd8;
  (this->m_aacRaw).m_channels = '\0';
  (this->m_aacRaw).m_sample_rate = 48000;
  (this->m_aacRaw).m_samples = 0;
  (this->m_aacRaw).m_bit_rate = 0;
  (this->m_aacRaw).m_sample_rates_index = '\0';
  (this->m_aacRaw).m_channels_index = '\0';
  (this->m_aacRaw).m_profile = '\0';
  (this->m_aacRaw).m_rdb = '\0';
  (this->m_aacRaw).m_id = 1;
  (this->m_aacRaw).m_layer = 0;
  AACCodec::readConfig(&this->m_aacRaw,buff,size);
  return;
}

Assistant:

ParsedAACTrackData::ParsedAACTrackData(uint8_t* buff, const int size) : ParsedTrackPrivData(buff, size)
{
    m_aacRaw.m_id = 1;  // MPEG2
    m_aacRaw.m_layer = 0;
    m_aacRaw.m_rdb = 0;
    m_aacRaw.readConfig(buff, size);
}